

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

void __thiscall OPNMIDIplay::partialReset(OPNMIDIplay *this)

{
  int emulator;
  uint uVar1;
  unsigned_long PCM_RATE;
  OPN2 *this_00;
  OPNFamily family;
  OpnChannel local_88;
  OPN2 *local_18;
  Synth *synth;
  OPNMIDIplay *this_local;
  
  synth = (Synth *)this;
  local_18 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator*(&this->m_synth);
  realTime_panic(this);
  this_00 = local_18;
  (this->m_setup).tick_skip_samples_delay = 0;
  local_18->m_runAtPcmRate = (bool)((this->m_setup).runAtPcmRate & 1);
  emulator = (this->m_setup).emulator;
  PCM_RATE = (this->m_setup).PCM_RATE;
  family = OPN2::chipFamily(local_18);
  OPN2::reset(this_00,emulator,PCM_RATE,family,this);
  std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::clear
            (&this->m_chipChannels);
  uVar1 = local_18->m_numChannels;
  OpnChannel::OpnChannel(&local_88);
  std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::resize
            (&this->m_chipChannels,(ulong)uVar1,&local_88);
  OpnChannel::~OpnChannel(&local_88);
  resetMIDIDefaults(this,0);
  return;
}

Assistant:

void OPNMIDIplay::partialReset()
{
    Synth &synth = *m_synth;
    realTime_panic();
    m_setup.tick_skip_samples_delay = 0;
    synth.m_runAtPcmRate = m_setup.runAtPcmRate;
    synth.reset(m_setup.emulator, m_setup.PCM_RATE, synth.chipFamily(), this);
    m_chipChannels.clear();
    m_chipChannels.resize(synth.m_numChannels);
    resetMIDIDefaults();
#if defined(OPNMIDI_MIDI2VGM) && !defined(OPNMIDI_DISABLE_MIDI_SEQUENCER)
    m_sequencerInterface->onloopStart = synth.m_loopStartHook;
    m_sequencerInterface->onloopStart_userData = synth.m_loopStartHookData;
    m_sequencerInterface->onloopEnd = synth.m_loopEndHook;
    m_sequencerInterface->onloopEnd_userData = synth.m_loopEndHookData;
    m_sequencer->setLoopHooksOnly(m_sequencerInterface->onloopStart != NULL);
#endif
}